

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

void __thiscall
capnp::EzRpcServer::Impl::acceptLoop
          (Impl *this,Own<kj::ConnectionReceiver> *listener,ReaderOptions readerOpts)

{
  Own<kj::_::PromiseNode> local_78;
  undefined1 local_68 [16];
  Impl *local_58;
  Disposer *local_50;
  int local_48;
  Own<kj::ConnectionReceiver> local_40;
  
  (**listener->ptr->_vptr_ConnectionReceiver)
            ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:294:9),_kj::Own<kj::ConnectionReceiver>_>
              *)local_68);
  local_40.disposer = listener->disposer;
  local_40.ptr = listener->ptr;
  listener->ptr = (ConnectionReceiver *)0x0;
  local_58 = this;
  local_50 = (Disposer *)readerOpts.traversalLimitInWords;
  local_48 = readerOpts.nestingLimit;
  kj::Promise<kj::Own<kj::AsyncIoStream>>::
  then<kj::CaptureByMove<capnp::EzRpcServer::Impl::acceptLoop(kj::Own<kj::ConnectionReceiver>&&,capnp::ReaderOptions)::_lambda(kj::Own<kj::ConnectionReceiver>&&,kj::Own<kj::AsyncIoStream>&&)_1_,kj::Own<kj::ConnectionReceiver>>,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_78,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:294:9),_kj::Own<kj::ConnectionReceiver>_>
              *)local_68,(PropagateException *)&local_58);
  kj::TaskSet::add(&this->tasks,(Promise<void> *)&local_78);
  kj::Own<kj::_::PromiseNode>::dispose(&local_78);
  kj::Own<kj::ConnectionReceiver>::dispose(&local_40);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_68);
  return;
}

Assistant:

void acceptLoop(kj::Own<kj::ConnectionReceiver>&& listener, ReaderOptions readerOpts) {
    auto ptr = listener.get();
    tasks.add(ptr->accept().then(kj::mvCapture(kj::mv(listener),
        [this, readerOpts](kj::Own<kj::ConnectionReceiver>&& listener,
                           kj::Own<kj::AsyncIoStream>&& connection) {
      acceptLoop(kj::mv(listener), readerOpts);

      auto server = kj::heap<ServerContext>(kj::mv(connection), *this, readerOpts);

      // Arrange to destroy the server context when all references are gone, or when the
      // EzRpcServer is destroyed (which will destroy the TaskSet).
      tasks.add(server->network.onDisconnect().attach(kj::mv(server)));
    })));
  }